

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

cmCommand * __thiscall
cmCTestSetTestsPropertiesCommand::Clone(cmCTestSetTestsPropertiesCommand *this)

{
  cmCTestSetTestsPropertiesCommand *this_00;
  cmCTestSetTestsPropertiesCommand *c;
  cmCTestSetTestsPropertiesCommand *this_local;
  
  this_00 = (cmCTestSetTestsPropertiesCommand *)operator_new(0x58);
  cmCTestSetTestsPropertiesCommand(this_00);
  this_00->TestHandler = this->TestHandler;
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestSetTestsPropertiesCommand* c
      = new cmCTestSetTestsPropertiesCommand;
    c->TestHandler = this->TestHandler;
    return c;
    }